

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void dump_bb(dill_stream c,basic_block *bb,int i)

{
  uint in_EDX;
  ulong *in_RSI;
  size_t j;
  void *in_stack_00000288;
  void *in_stack_00000290;
  dill_stream in_stack_00000298;
  bit_vec in_stack_ffffffffffffffe0;
  ulong uVar1;
  
  printf("\nBasic block %d, start %zd, end %zd, label %d, fall %d, branch_to %d\n",(ulong)in_EDX,
         *in_RSI,in_RSI[1],(ulong)(uint)in_RSI[2],(ulong)(uint)in_RSI[3],
         *(undefined4 *)((long)in_RSI + 0x14));
  printf("    defines :");
  dump_reg_vec(in_stack_ffffffffffffffe0);
  printf("\n    uses :");
  dump_reg_vec(in_stack_ffffffffffffffe0);
  printf("\n    live_at_end :");
  dump_reg_vec(in_stack_ffffffffffffffe0);
  printf("\n    succ :");
  for (uVar1 = 0; uVar1 < (ulong)(long)(int)in_RSI[5]; uVar1 = uVar1 + 1) {
    printf(" %d",(ulong)*(uint *)(in_RSI[6] + uVar1 * 4));
  }
  printf("\n    preds :");
  for (uVar1 = 0; uVar1 < (ulong)(long)*(int *)((long)in_RSI + 0x1c); uVar1 = uVar1 + 1) {
    printf(" %d",(ulong)*(uint *)(in_RSI[4] + uVar1 * 4));
  }
  if (*(int *)((long)in_RSI + 0x5c) != 0) {
    printf(" - LOOP_START");
  }
  if ((int)in_RSI[0xc] != 0) {
    printf(" - LOOP_END");
  }
  printf("\n");
  for (uVar1 = *in_RSI; uVar1 <= in_RSI[1]; uVar1 = uVar1 + 1) {
    printf(" %zd - ",uVar1);
    virtual_print_insn(in_stack_00000298,in_stack_00000290,in_stack_00000288);
    printf("\n");
  }
  return;
}

Assistant:

static void
dump_bb(dill_stream c, struct basic_block* bb, int i)
{
    size_t j;
    printf(
        "\nBasic block %d, start %zd, end %zd, label %d, fall %d, branch_to "
        "%d\n",
        i, bb->start, bb->end, bb->label, bb->fall_through,
        bb->end_branch_label);
    printf("    defines :");
    dump_reg_vec(bb->regs_defined);
    printf("\n    uses :");
    dump_reg_vec(bb->regs_used);
    printf("\n    live_at_end :");
    dump_reg_vec(bb->live_at_end);
    printf("\n    succ :");
    for (j = 0; j < bb->succ_count; j++) {
        printf(" %d", bb->succ_list[j]);
    }
    printf("\n    preds :");
    for (j = 0; j < bb->pred_count; j++) {
        printf(" %d", bb->pred_list[j]);
    }
    if (bb->is_loop_start)
        printf(" - LOOP_START");
    if (bb->is_loop_end)
        printf(" - LOOP_END");
    printf("\n");
    for (j = (size_t)bb->start; j <= (size_t)bb->end; j++) {
        printf(" %zd - ", j);
        virtual_print_insn(
            c, NULL,
            ((char*)c->p->virtual.code_base) + j * sizeof(virtual_insn));
        printf("\n");
    }
}